

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O3

void __thiscall
SparseArray_Assign_Test<pstore::uint128>::~SparseArray_Assign_Test
          (SparseArray_Assign_Test<pstore::uint128> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST (SparseArray, Assign) {
    auto arrp = sparse_array<int, TypeParam>::make_unique ({0, 2, 4});
    auto & arr = *arrp;

    arr[0] = 3;
    arr[2] = 5;
    arr[4] = 7;

    EXPECT_EQ (arr[0], 3);
    EXPECT_EQ (arr[2], 5);
    EXPECT_EQ (arr[4], 7);
    arr[4] = 11;
    EXPECT_EQ (arr[0], 3);
    EXPECT_EQ (arr[2], 5);
    EXPECT_EQ (arr[4], 11);
}